

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O0

string * __thiscall
anurbs::Entry<anurbs::BrepLoop>::key_abi_cxx11_
          (string *__return_storage_ptr__,Entry<anurbs::BrepLoop> *this)

{
  Entry<anurbs::BrepLoop> *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_key);
  return __return_storage_ptr__;
}

Assistant:

std::string key() const override
    {
        return m_key;
    }